

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O0

cycle_formatter_yyyymmdd * __thiscall
cornelich::cycle_formatter_yyyymmdd::date_from_cycle_impl_abi_cxx11_
          (cycle_formatter_yyyymmdd *this,int64_t cycle)

{
  long in_RDX;
  day local_301;
  uint local_300;
  month local_2f9;
  uint local_2f8;
  year local_2f2;
  int local_2f0;
  char local_2e9;
  int local_2e8;
  type local_2e4;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_2d8;
  char local_2c1;
  int local_2c0;
  type local_2bc;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_2b0;
  char local_299;
  int local_298;
  type local_294;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_288;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_278;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_268 [2];
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sink;
  year_month_day local_238;
  day_point local_234;
  year_month_day ymd;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>
  daypoint;
  duration<long,std::ratio<1l,1000000000l>> local_228 [8];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_220;
  time_point ts;
  time_t s;
  int64_t cycle_local;
  cycle_formatter_yyyymmdd *this_local;
  string *result;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  that;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  that_3;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  that_1;
  undefined1 local_121;
  undefined1 *local_120;
  undefined1 local_111;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  proto_child0 peStack_e0;
  expr_type that_2;
  expr_type that_4;
  
  ts.__d.__r = (duration)((in_RDX * *(int *)(cycle + 8)) / 1000);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1l>> *)&ymd,(long *)&ts);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            (local_228,(duration<long,_std::ratio<1L,_1L>_> *)&ymd);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_220,(duration *)local_228);
  local_234.__d.__r =
       (duration)
       date::
       floor<std::chrono::duration<int,std::ratio<86400l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                 (&local_220);
  date::year_month_day::year_month_day(&local_238,&local_234);
  sink.container._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::back_insert_iterator
            (&local_248,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_298 = 4;
  local_299 = '0';
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_294,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_298,&local_299,(is_false)0x0);
  local_288.child0 = &local_294;
  local_288.child1 = (proto_child1)&boost::spirit::int_;
  local_2c0 = 2;
  local_2c1 = '0';
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_2bc,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_2c0,&local_2c1,(is_false)0x0);
  local_2b0.child0 = &local_2bc;
  local_120 = &boost::spirit::uint_;
  local_f0 = &local_121;
  local_f8 = &boost::spirit::uint_;
  local_2b0.child1 = (proto_child1)&boost::spirit::uint_;
  local_278.child0 = &local_288;
  local_278.child1 = (proto_child1)&local_2b0;
  local_2e8 = 2;
  local_2e9 = '0';
  peStack_e0 = local_278.child0;
  that_2.child0 = (proto_child0)local_278.child1;
  that_2.child1 = local_278.child1;
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_2e4,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_2e8,&local_2e9,(is_false)0x0);
  local_2d8.child0 = &local_2e4;
  local_110 = &boost::spirit::uint_;
  local_100 = &local_111;
  local_108 = &boost::spirit::uint_;
  local_2d8.child1 = (proto_child1)&boost::spirit::uint_;
  local_268[0].child0 = &local_278;
  local_268[0].child1 = &local_2d8;
  local_2f2 = date::year_month_day::year(&local_238);
  local_2f0 = date::year::operator_cast_to_int(&local_2f2);
  local_2f9 = date::year_month_day::month(&local_238);
  local_2f8 = date::month::operator_cast_to_unsigned_int(&local_2f9);
  local_301 = date::year_month_day::day(&local_238);
  local_300 = date::day::operator_cast_to_unsigned_int(&local_301);
  boost::spirit::karma::
  generate<std::back_insert_iterator<std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::uint_>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::uint_>const&>,2l>const&>,2l>,int,unsigned_int,unsigned_int>
            (&local_248,local_268,&local_2f0,&local_2f8,&local_300);
  return this;
}

Assistant:

std::string cycle_formatter_yyyymmdd::date_from_cycle_impl(std::int64_t cycle) const
{
    const auto s = static_cast<std::time_t>(cycle * m_cycle_length / 1000);
    auto ts = system_clock::time_point(seconds(s));
    auto daypoint = floor<days>(ts);
    auto ymd = year_month_day(daypoint);

    using namespace boost::spirit;

    std::string result;
    std::back_insert_iterator<std::string> sink(result);
    karma::generate(sink,
                    karma::right_align(4, '0')[karma::int_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_],
            int(ymd.year()), unsigned(ymd.month()), unsigned(ymd.day()));
    return result;
}